

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

bool __thiscall
ot::commissioner::security_material::SecurityMaterials::IsIncomplete
          (SecurityMaterials *this,bool aNeedCert,bool aNeedPSKc,bool aNeedToken)

{
  size_type sVar1;
  bool local_22;
  bool aNeedToken_local;
  bool aNeedPSKc_local;
  bool aNeedCert_local;
  SecurityMaterials *this_local;
  
  if (aNeedCert) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mCertificate);
    if (sVar1 == 0) {
      return true;
    }
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mPrivateKey);
    if (sVar1 == 0) {
      return true;
    }
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mTrustAnchor);
    if (sVar1 == 0) {
      return true;
    }
  }
  if ((aNeedToken) &&
     (sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->mCommissionerToken), sVar1 == 0)) {
    return true;
  }
  local_22 = false;
  if (aNeedPSKc) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mPSKc);
    local_22 = sVar1 == 0;
  }
  return local_22;
}

Assistant:

bool SecurityMaterials::IsIncomplete(bool aNeedCert, bool aNeedPSKc, bool aNeedToken /*=false*/) const
{
    return (aNeedCert && (mCertificate.size() == 0 || mPrivateKey.size() == 0 || mTrustAnchor.size() == 0)) ||
           (aNeedToken && mCommissionerToken.size() == 0) || (aNeedPSKc && mPSKc.size() == 0);
}